

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigenvalue.hpp
# Opt level: O1

void __thiscall
JAMA::Eigenvalue<double>::Eigenvalue(Eigenvalue<double> *this,DynamicRectMatrix<double> *A)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  double **ppdVar4;
  double **ppdVar5;
  double *pdVar6;
  double *pdVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  int j;
  allocator_type local_79;
  vector<double,_std::allocator<double>_> local_78;
  DynamicRectMatrix<double> *local_60;
  DynamicVector<double,_std::allocator<double>_> *local_58;
  DynamicRectMatrix<double> local_50;
  DynamicRectMatrix<double> local_40;
  
  local_60 = &this->H;
  local_58 = &this->ort;
  (this->ort).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ort).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->H).data_ = (double **)0x0;
  (this->H).nrow_ = 0;
  (this->H).ncol_ = 0;
  (this->V).data_ = (double **)0x0;
  (this->V).nrow_ = 0;
  (this->V).ncol_ = 0;
  (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ort).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = A->ncol_;
  this->n = uVar3;
  OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
            ((DynamicRectMatrix<double> *)&local_78,uVar3,uVar3);
  OpenMD::DynamicRectMatrix<double>::operator=(&local_40,&this->V);
  OpenMD::DynamicRectMatrix<double>::deallocate(&local_40);
  OpenMD::DynamicRectMatrix<double>::deallocate((DynamicRectMatrix<double> *)&local_78);
  std::vector<double,_std::allocator<double>_>::vector(&local_78,(long)this->n,&local_79);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&(this->d).data_,&local_78);
  if ((double **)
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double **)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_78,(long)this->n,&local_79);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&(this->e).data_);
  if ((double **)
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double **)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  this->issymmetric = 1;
  uVar3 = this->n;
  uVar10 = (ulong)(int)uVar3;
  if (0 < (long)uVar10) {
    ppdVar4 = A->data_;
    uVar11 = this->issymmetric;
    uVar9 = 0;
    do {
      if (uVar11 != 0) {
        uVar13 = 1;
        while( true ) {
          dVar1 = ppdVar4[uVar13 - 1][uVar9];
          dVar2 = ppdVar4[uVar9][uVar13 - 1];
          if (uVar10 <= uVar13) break;
          uVar13 = uVar13 + 1;
          if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
        }
        uVar11 = -(uint)(dVar1 == dVar2) & 1;
        this->issymmetric = uVar11;
      }
      uVar9 = uVar9 + 1;
    } while ((uVar9 < uVar10) && (uVar11 != 0));
    if (uVar11 == 0) {
      OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
                ((DynamicRectMatrix<double> *)&local_78,uVar3,uVar3);
      OpenMD::DynamicRectMatrix<double>::operator=(&local_50,local_60);
      OpenMD::DynamicRectMatrix<double>::deallocate(&local_50);
      OpenMD::DynamicRectMatrix<double>::deallocate((DynamicRectMatrix<double> *)&local_78);
      std::vector<double,_std::allocator<double>_>::vector(&local_78,(long)this->n,&local_79);
      std::vector<double,_std::allocator<double>_>::_M_move_assign(&local_58->data_);
      if ((double **)
          local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double **)0x0) {
        operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      lVar8 = (long)this->n;
      if (0 < lVar8) {
        ppdVar4 = A->data_;
        ppdVar5 = local_60->data_;
        lVar12 = 0;
        do {
          lVar14 = 0;
          do {
            ppdVar5[lVar14][lVar12] = ppdVar4[lVar14][lVar12];
            lVar14 = lVar14 + 1;
          } while (lVar8 != lVar14);
          lVar12 = lVar12 + 1;
        } while (lVar12 != lVar8);
      }
      orthes(this);
      hqr2(this);
      return;
    }
  }
  if (0 < (int)uVar3) {
    ppdVar4 = A->data_;
    ppdVar5 = (this->V).data_;
    uVar9 = 0;
    do {
      pdVar6 = ppdVar4[uVar9];
      pdVar7 = ppdVar5[uVar9];
      uVar13 = 0;
      do {
        pdVar7[uVar13] = pdVar6[uVar13];
        uVar13 = uVar13 + 1;
      } while (uVar10 != uVar13);
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar10);
  }
  tred2(this);
  tql2(this);
  return;
}

Assistant:

Eigenvalue(const DynamicRectMatrix<Real>& A) {
      n = A.getNCol();
      V = DynamicRectMatrix<Real>(n, n);
      d = DynamicVector<Real>(n);
      e = DynamicVector<Real>(n);

      issymmetric = 1;
      for (int j = 0; (j < n) && issymmetric; j++) {
        for (int i = 0; (i < n) && issymmetric; i++) {
          issymmetric = (A(i, j) == A(j, i));
        }
      }

      if (issymmetric) {
        for (int i = 0; i < n; i++) {
          for (int j = 0; j < n; j++) {
            V(i, j) = A(i, j);
          }
        }

        // Tridiagonalize.
        tred2();

        // Diagonalize.
        tql2();

      } else {
        H   = DynamicRectMatrix<Real>(n, n);
        ort = DynamicVector<Real>(n);

        for (int j = 0; j < n; j++) {
          for (int i = 0; i < n; i++) {
            H(i, j) = A(i, j);
          }
        }

        // Reduce to Hessenberg form.
        orthes();

        // Reduce Hessenberg to real Schur form.
        hqr2();
      }
    }